

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalLeftDelimJoin::PhysicalLeftDelimJoin
          (PhysicalLeftDelimJoin *this,PhysicalPlanGenerator *planner,
          vector<duckdb::LogicalType,_true> *types,PhysicalOperator *original_join,
          PhysicalOperator *distinct,
          vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *delim_scans,
          idx_t estimated_cardinality,optional_idx delim_idx)

{
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  pointer *pprVar1;
  iterator __position;
  optional_idx oVar2;
  reference pvVar3;
  pointer this_01;
  PhysicalOperator *pPVar4;
  pointer prVar5;
  PhysicalColumnDataScan *cast_cached_scan;
  PhysicalOperatorType local_41;
  void *local_40;
  vector<duckdb::LogicalType,_true> local_38;
  
  oVar2.index = delim_idx.index;
  local_38.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhysicalDelimJoin::PhysicalDelimJoin
            (&this->super_PhysicalDelimJoin,LEFT_DELIM_JOIN,&local_38,original_join,distinct,
             delim_scans,estimated_cardinality,delim_idx);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_38);
  (this->super_PhysicalDelimJoin).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalDelimJoin_019937c0;
  pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&((this->super_PhysicalDelimJoin).join)->children,0);
  this_00 = &(this->super_PhysicalDelimJoin).super_PhysicalOperator.children;
  __position._M_current =
       *(pointer *)
        ((long)&(this->super_PhysicalDelimJoin).super_PhysicalOperator.children.
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (__position._M_current ==
      *(pointer *)
       ((long)&(this->super_PhysicalDelimJoin).super_PhysicalOperator.children.
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>const&>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)this_00,__position,pvVar3);
  }
  else {
    (__position._M_current)->_M_data = pvVar3->_M_data;
    pprVar1 = (pointer *)
              ((long)&(this->super_PhysicalDelimJoin).super_PhysicalOperator.children.
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    *pprVar1 = *pprVar1 + 1;
  }
  pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,0);
  pPVar4 = pvVar3->_M_data;
  local_41 = COLUMN_DATA_SCAN;
  local_40 = (void *)0x0;
  this_01 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
            operator->(&planner->physical_plan);
  pPVar4 = PhysicalPlan::
           Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::PhysicalOperatorType,unsigned_long&,decltype(nullptr)>
                     (this_01,&pPVar4->types,&local_41,&estimated_cardinality,&local_40);
  if (oVar2.index != 0xffffffffffffffff) {
    prVar5 = (pointer)optional_idx::GetIndex(&delim_idx);
    pPVar4[1].children.
    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    ._M_impl.super__Vector_impl_data._M_start = prVar5;
  }
  pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&((this->super_PhysicalDelimJoin).join)->children,0);
  pvVar3->_M_data = pPVar4;
  return;
}

Assistant:

PhysicalLeftDelimJoin::PhysicalLeftDelimJoin(PhysicalPlanGenerator &planner, vector<LogicalType> types,
                                             PhysicalOperator &original_join, PhysicalOperator &distinct,
                                             const vector<const_reference<PhysicalOperator>> &delim_scans,
                                             idx_t estimated_cardinality, optional_idx delim_idx)
    : PhysicalDelimJoin(PhysicalOperatorType::LEFT_DELIM_JOIN, std::move(types), original_join, distinct, delim_scans,
                        estimated_cardinality, delim_idx) {
	D_ASSERT(join.children.size() == 2);
	// now for the original join
	// we take its left child, this is the side that we will duplicate eliminate
	children.push_back(join.children[0]);

	// we replace it with a PhysicalColumnDataScan, that scans the ColumnDataCollection that we keep cached
	// the actual chunk collection to scan will be created in the LeftDelimJoinGlobalState
	auto &cached_scan = planner.Make<PhysicalColumnDataScan>(
	    children[0].get().GetTypes(), PhysicalOperatorType::COLUMN_DATA_SCAN, estimated_cardinality, nullptr);
	if (delim_idx.IsValid()) {
		auto &cast_cached_scan = cached_scan.Cast<PhysicalColumnDataScan>();
		cast_cached_scan.cte_index = delim_idx.GetIndex();
	}
	join.children[0] = cached_scan;
}